

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

_Bool rf_check_collision_boxes(rf_bounding_box box1,rf_bounding_box box2)

{
  _Bool _Var1;
  
  if ((box2.min.x <= box1.max.x) && (box1.min.x <= box2.max.x)) {
    if ((box1.max.y < box2.min.y) || (_Var1 = true, box2.max.y < box1.min.y)) {
      _Var1 = false;
    }
    if ((box2.min.z <= box1.max.z) && (box1.min.z <= box2.max.z)) {
      return _Var1;
    }
  }
  return false;
}

Assistant:

RF_API bool rf_check_collision_boxes(rf_bounding_box box1, rf_bounding_box box2)
{
    bool collision = true;

    if ((box1.max.x >= box2.min.x) && (box1.min.x <= box2.max.x))
    {
        if ((box1.max.y < box2.min.y) || (box1.min.y > box2.max.y)) collision = false;
        if ((box1.max.z < box2.min.z) || (box1.min.z > box2.max.z)) collision = false;
    } else collision = false;

    return collision;
}